

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O1

void raster_size(char *fn,int *x,int *y,int *a)

{
  ulong uVar1;
  float fVar2;
  disp_field512_t *padVar3;
  disp_field512_t *padVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  undefined4 uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ssize_t sVar13;
  int *piVar14;
  qnode_ptr_t p;
  qnode_ptr_t p_00;
  int iVar15;
  char *s3;
  long lVar16;
  int extraout_EDX;
  undefined4 *extraout_RDX;
  char *s3_00;
  uint *puVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int *unaff_RBX;
  long lVar21;
  undefined4 *unaff_RBP;
  ulong uVar22;
  undefined4 *__buf;
  int *piVar23;
  int *__s2;
  char *__src;
  long lVar24;
  uint *in_R8;
  uint *in_R9;
  int iVar25;
  byte bVar26;
  undefined4 *unaff_R14;
  long lVar27;
  uint *unaff_R15;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined4 *unaff_retaddr;
  raster_t hd;
  int *in_stack_00000028;
  undefined8 in_stack_00000030;
  uint *in_stack_00000038;
  undefined4 *in_stack_00000040;
  undefined8 in_stack_00000048;
  undefined8 in_stack_00000050;
  int iStack_240;
  int iStack_23c;
  char acStack_178 [80];
  int aiStack_128 [20];
  char acStack_d8 [88];
  int *piStack_80;
  uint *puStack_48;
  undefined4 local_40;
  int local_3c;
  int local_38;
  undefined4 uStack_34;
  int *piStack_30;
  int *piStack_28;
  
  iVar12 = 0;
  uVar8 = open(fn,0);
  if ((int)uVar8 < 1) {
    raster_size_cold_1();
LAB_00104304:
    raster_size_cold_2();
  }
  else {
    __buf = &local_40;
    fn = (char *)(ulong)uVar8;
    sVar13 = read(uVar8,__buf,0x20);
    iVar12 = (int)__buf;
    if (sVar13 != 0x20) goto LAB_00104304;
    *x = local_3c;
    *y = local_38;
    iVar10 = local_38;
    if (local_38 < *x) {
      iVar10 = *x;
    }
    iVar15 = 0x200;
    if (((iVar10 - 0x101U < 0x100) || (iVar15 = 0x100, iVar10 - 0x81U < 0x80)) ||
       (iVar15 = 0x80, iVar10 - 0x41U < 0x40)) {
      *a = iVar15;
      close(uVar8);
      return;
    }
  }
  raster_size_cold_3();
  if (iVar12 < (int)fn) {
    iVar12 = (int)fn;
  }
  uVar9 = 0x200;
  if (iVar12 - 0x101U < 0x100) {
LAB_00104346:
    *extraout_RDX = uVar9;
    return;
  }
  s3 = (char *)(ulong)(iVar12 - 0x81U);
  uVar9 = 0x100;
  if (iVar12 - 0x81U < 0x80) goto LAB_00104346;
  piVar23 = (int *)(ulong)(iVar12 - 0x41U);
  uVar9 = 0x80;
  if (iVar12 - 0x41U < 0x40) goto LAB_00104346;
  binary_size_cold_1();
  iVar12 = (int)fn;
  piStack_80 = a;
  if (iVar12 == 1) {
LAB_00104b0b:
    usage();
  }
  if (iVar12 - 4U < 0x15) {
    fn = (char *)CONCAT44(uStack_34,local_38);
    *in_stack_00000040 = 0;
    *piStack_30 = 1;
    *piStack_28 = 1;
    *unaff_RBX = 0;
    *unaff_R14 = 2;
    *puStack_48 = 1;
    *(int *)fn = 0;
    *unaff_R15 = 3;
    *unaff_retaddr = 0;
    *in_stack_00000028 = 0;
    *in_stack_00000038 = 10;
    *(undefined2 *)(hd._0_8_ + 8) = 100;
    *(undefined8 *)hd._0_8_ = 0x656e696665646e55;
    *(undefined2 *)(hd._8_8_ + 8) = 100;
    *(undefined8 *)hd._8_8_ = 0x656e696665646e55;
    *(undefined2 *)(hd._16_8_ + 8) = 100;
    *(undefined8 *)hd._16_8_ = 0x656e696665646e55;
    *(undefined2 *)(hd._24_8_ + 8) = 100;
    *(undefined8 *)hd._24_8_ = 0x656e696665646e55;
    bVar7 = true;
    __src = (char *)hd._16_8_;
    if (4 < iVar12) {
      uVar8 = 4;
      bVar7 = false;
LAB_00104487:
      uVar22 = (ulong)uVar8;
      __s2 = *(int **)(piVar23 + uVar22 * 2);
      fn = "-NR";
      __src = (char *)__s2;
      iVar10 = strcmp("-NR",(char *)__s2);
      piVar14 = piStack_30;
      if (iVar10 == 0) {
LAB_001045c5:
        *piVar14 = 0;
        iVar10 = 1;
      }
      else {
        iVar10 = strcmp("-F",(char *)__s2);
        if (iVar10 == 0) {
          uVar11 = uVar8 + 1;
          if ((int)uVar11 < iVar12) {
            __isoc99_sscanf(*(undefined8 *)(piVar23 + (ulong)uVar11 * 2),"%f",unaff_retaddr);
            __src = *(char **)(piVar23 + (ulong)uVar11 * 2);
            fn = (char *)aiStack_128;
            strcpy(fn,__src);
            if (*unaff_RBX != 1) {
              *unaff_RBX = 1;
              *unaff_RBP = 0;
              goto LAB_0010472a;
            }
          }
          else {
            valid_option_cold_9();
          }
          valid_option_cold_10();
LAB_00104b06:
          valid_option_cold_8();
          goto LAB_00104b0b;
        }
        iVar10 = strcmp("-C",(char *)__s2);
        if (iVar10 == 0) {
          if (iVar12 <= (int)(uVar8 + 3)) goto LAB_00104b06;
          strcpy((char *)hd._16_8_,*(char **)(piVar23 + uVar22 * 2 + 2));
          __isoc99_sscanf(*(undefined8 *)(piVar23 + uVar22 * 2 + 4),"%d",in_stack_00000028);
          fn = *(char **)(piVar23 + (ulong)(uVar8 + 3) * 2);
          __src = "%f";
          __isoc99_sscanf(fn,"%f",in_stack_00000030);
          *(undefined4 *)CONCAT44(local_3c,local_40) = 0;
          *(undefined4 *)CONCAT44(uStack_34,local_38) = 1;
          iVar10 = 4;
        }
        else {
          fn = "-P";
          __src = (char *)__s2;
          iVar10 = strcmp("-P",(char *)__s2);
          piVar14 = piStack_28;
          if (iVar10 == 0) goto LAB_001045c5;
          fn = "-L";
          __src = (char *)__s2;
          iVar10 = strcmp("-L",(char *)__s2);
          if (iVar10 == 0) {
            if (iVar12 <= (int)(uVar8 + 1)) goto LAB_00104b29;
            fn = *(char **)(piVar23 + (ulong)(uVar8 + 1) * 2);
            puVar17 = puStack_48;
          }
          else {
            fn = "-I";
            piVar14 = __s2;
            iVar10 = strcmp("-I",(char *)__s2);
            if (iVar10 == 0) {
              __s2 = piVar14;
              if (iVar12 <= (int)(uVar8 + 1)) goto LAB_00104b2e;
              fn = *(char **)(piVar23 + (ulong)(uVar8 + 1) * 2);
              puVar17 = in_stack_00000038;
            }
            else {
              fn = "-W";
              __src = (char *)__s2;
              iVar10 = strcmp("-W",(char *)__s2);
              if (iVar10 != 0) {
                fn = "-N";
                __src = (char *)__s2;
                iVar10 = strcmp("-N",(char *)__s2);
                if (iVar10 == 0) {
                  if ((int)(uVar8 + 2) < iVar12) {
                    __isoc99_sscanf(*(undefined8 *)(piVar23 + uVar22 * 2 + 2),"%d",in_R8);
                    fn = *(char **)(piVar23 + (ulong)(uVar8 + 2) * 2);
                    __src = "%d";
                    __isoc99_sscanf(fn,"%d",in_R9);
                    bVar7 = true;
                    iVar10 = 3;
                    goto LAB_0010472f;
                  }
                  goto LAB_00104b47;
                }
                fn = "-B";
                iVar10 = strcmp("-B",(char *)__s2);
                if (iVar10 != 0) goto LAB_00104b33;
                if (iVar12 <= (int)(uVar8 + 2)) goto LAB_00104b38;
                __isoc99_sscanf(*(undefined8 *)(piVar23 + uVar22 * 2 + 2),"%d",in_stack_00000050);
                fn = *(char **)(piVar23 + (ulong)(uVar8 + 2) * 2);
                __src = "%d";
                __isoc99_sscanf(fn,"%d",in_stack_00000048);
                *in_stack_00000040 = 1;
                iVar10 = 3;
                goto LAB_0010472f;
              }
              if (iVar12 <= (int)(uVar8 + 1)) goto LAB_00104b3d;
              fn = *(char **)(piVar23 + (ulong)(uVar8 + 1) * 2);
              puVar17 = unaff_R15;
            }
          }
          __src = "%d";
          __isoc99_sscanf(fn,"%d",puVar17);
LAB_0010472a:
          iVar10 = 2;
        }
      }
LAB_0010472f:
      uVar8 = uVar8 + iVar10;
      if (iVar12 <= (int)uVar8) goto LAB_00104789;
      goto LAB_00104487;
    }
    goto LAB_001047a6;
  }
  valid_option_cold_1();
  __src = (char *)piVar23;
LAB_00104b15:
  valid_option_cold_15();
LAB_00104b1a:
  valid_option_cold_14();
LAB_00104b1f:
  valid_option_cold_12();
  goto LAB_00104b24;
LAB_00104789:
  bVar7 = !bVar7;
LAB_001047a6:
  if (100 < *in_stack_00000028) goto LAB_00104b15;
  if (4 < (int)*puStack_48) goto LAB_00104b1a;
  if ((7 < *unaff_R15) || ((0xa8U >> (*unaff_R15 & 0x1f) & 1) == 0)) goto LAB_00104b42;
  if (bVar7) goto LAB_00104b1f;
  if (*in_R8 != *in_R9) {
    concat(*(char **)(piVar23 + 2),"/",s3_00);
    concat(*(char **)(piVar23 + 4),"/",s3);
    concat(s3_00,*(char **)(piVar23 + 6),(char *)hd._0_8_);
    acStack_178[2] = 0;
    acStack_178[0] = '-';
    acStack_178[1] = 'n';
    sprintf(acStack_d8,"%d",(ulong)*in_R8);
    concat(acStack_178,acStack_d8,acStack_178);
    concat(acStack_178,"-",acStack_178);
    sprintf(acStack_d8,"%d",(ulong)*in_R9);
    concat(acStack_178,acStack_d8,acStack_178);
    concat(acStack_178,"-w",acStack_178);
    sprintf(acStack_d8,"%d",(ulong)*unaff_R15);
    concat(acStack_178,acStack_d8,acStack_178);
    concat(acStack_178,"-l",acStack_178);
    sprintf(acStack_d8,"%d",(ulong)*puStack_48);
    concat(acStack_178,acStack_d8,acStack_178);
    concat(acStack_178,"-i",acStack_178);
    sprintf(acStack_d8,"%d",(ulong)*in_stack_00000038);
    concat(acStack_178,acStack_d8,acStack_178);
    if (*piStack_30 == 0) {
      concat(acStack_178,"-r",acStack_178);
    }
    if (*piStack_28 == 0) {
      concat(acStack_178,"-s",acStack_178);
    }
    if (*unaff_RBX != 0) {
      concat(acStack_178,"-f",acStack_178);
      concat(acStack_178,(char *)aiStack_128,acStack_178);
    }
    concat(s3,*(char **)piVar23,(char *)hd._8_8_);
    concat((char *)hd._8_8_,".",(char *)hd._8_8_);
    concat((char *)hd._8_8_,*(char **)(piVar23 + 6),(char *)hd._8_8_);
    concat((char *)hd._8_8_,"F",(char *)hd._8_8_);
    concat((char *)hd._8_8_,acStack_178,(char *)hd._8_8_);
    if (*(int *)CONCAT44(uStack_34,local_38) != 0) {
      concat(s3,*(char **)piVar23,(char *)hd._24_8_);
      concat((char *)hd._24_8_,".",(char *)hd._24_8_);
      concat((char *)hd._24_8_,*(char **)(piVar23 + 6),(char *)hd._24_8_);
      concat((char *)hd._24_8_,"H",(char *)hd._24_8_);
      concat((char *)hd._24_8_,acStack_178,(char *)hd._24_8_);
    }
    printf(" Generated velocity filename  : %s\n",hd._8_8_);
    printf(" Generated histogram filename : %s\n",hd._24_8_);
    printf(" Input stem name              : %s\n",hd._0_8_);
    printf(" Correct velocity filename    : %s\n",hd._16_8_);
    fflush(_stdout);
    return;
  }
LAB_00104b24:
  valid_option_cold_11();
LAB_00104b29:
  valid_option_cold_7();
  __s2 = (int *)__src;
LAB_00104b2e:
  valid_option_cold_6();
LAB_00104b33:
  valid_option_cold_2();
LAB_00104b38:
  valid_option_cold_3();
  __src = (char *)__s2;
LAB_00104b3d:
  valid_option_cold_5();
LAB_00104b42:
  valid_option_cold_13();
LAB_00104b47:
  valid_option_cold_4();
  if ((*(int *)fn == *(int *)((long)fn + 4)) && (*(int *)__src == *(int *)((long)__src + 4))) {
    return;
  }
  valid_size_cold_1();
  iVar12 = *(int *)fn;
  iVar10 = *(int *)((long)fn + 4);
  iVar15 = *(int *)((long)fn + 8);
  p = (qnode_ptr_t)malloc(0x40);
  p->res = iVar12;
  p->sizx = iVar10;
  p->sizy = iVar15;
  iVar19 = 0;
  p->level = 0;
  p_00 = (qnode_ptr_t)malloc(0x40);
  p_00->res = iVar12;
  p_00->sizx = iVar10;
  p_00->sizy = iVar15;
  p_00->level = 0;
  alloc_flow(p);
  alloc_flow(p_00);
  if (0 < *(int *)((long)fn + 8)) {
    do {
      if (0 < *(int *)((long)fn + 4)) {
        iVar12 = p_00->res;
        padVar3 = p_00->flow_ptr;
        lVar18 = 0;
        do {
          (*padVar3)[(long)iVar12 * (long)iVar19 + lVar18] =
               *(disp_vect_t *)
                (*(long *)((long)fn + 0x28) + ((long)*(int *)fn * (long)iVar19 + lVar18) * 8);
          lVar18 = lVar18 + 1;
        } while (lVar18 < *(int *)((long)fn + 4));
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < *(int *)((long)fn + 8));
  }
  if (0 < extraout_EDX) {
    iVar12 = 0;
    do {
      iVar10 = *(int *)((long)fn + 8);
      bVar7 = 0 < iVar10;
      if (0 < iVar10) {
        uVar8 = *(uint *)((long)fn + 4);
        iVar19 = 0;
        iVar15 = -1;
        iStack_240 = 1;
        do {
          if (0 < (int)uVar8) {
            padVar3 = p->flow_ptr;
            iVar25 = p->res * iVar19;
            uVar22 = 0;
            do {
              bVar6 = iVar10 <= iVar19 + 1;
              if (bVar6) {
                fVar28 = 0.0;
                fVar36 = 0.0;
              }
              else {
                lVar18 = (long)p_00->res * (long)iStack_240 + uVar22;
                fVar28 = (*p_00->flow_ptr)[lVar18].x + 0.0;
                fVar36 = (*p_00->flow_ptr)[lVar18].y + 0.0;
              }
              bVar26 = !bVar6;
              if (iVar19 != 0) {
                lVar18 = (long)iVar15 * (long)p_00->res + uVar22;
                fVar28 = fVar28 + (*p_00->flow_ptr)[lVar18].x;
                fVar36 = fVar36 + (*p_00->flow_ptr)[lVar18].y;
                bVar26 = bVar26 + 1;
              }
              uVar1 = uVar22 + 1;
              if ((bool)((long)uVar1 < (long)(int)uVar8 & bVar7)) {
                iVar20 = p_00->res * iVar19 + (int)uVar22 + 1;
                fVar28 = fVar28 + (*p_00->flow_ptr)[iVar20].x;
                fVar36 = fVar36 + (*p_00->flow_ptr)[iVar20].y;
                bVar26 = bVar26 + 1;
              }
              if (uVar22 != 0 && bVar7 == true) {
                iVar20 = p_00->res * iVar19 + (int)uVar22 + -1;
                fVar28 = fVar28 + (*p_00->flow_ptr)[iVar20].x;
                fVar36 = fVar36 + (*p_00->flow_ptr)[iVar20].y;
                bVar26 = bVar26 + 1;
              }
              (*padVar3)[(long)iVar25 + uVar22].x = fVar28 / (float)bVar26;
              (*padVar3)[(long)iVar25 + uVar22].y = fVar36 / (float)bVar26;
              uVar22 = uVar1;
            } while (uVar8 != uVar1);
          }
          iVar19 = iVar19 + 1;
          iVar15 = iVar15 + 1;
          iStack_240 = iStack_240 + 1;
          bVar7 = iVar19 < iVar10;
        } while (iVar19 != iVar10);
      }
      if (0 < *(int *)((long)fn + 8)) {
        iStack_23c = 0;
        do {
          if (0 < *(int *)((long)fn + 4)) {
            padVar3 = p->flow_ptr;
            padVar4 = p_00->flow_ptr;
            iVar10 = p_00->res * iStack_23c;
            lVar21 = (long)iStack_23c;
            lVar18 = p->res * lVar21;
            lVar27 = 0;
            do {
              fVar28 = (*padVar3)[lVar18 + lVar27].x;
              fVar36 = (*padVar3)[lVar18 + lVar27].y;
              lVar5 = *(long *)((long)__src + 0x20);
              lVar16 = *(int *)__src * lVar21 + lVar27;
              fVar37 = *(float *)(lVar5 + 8 + lVar16 * 0xc);
              fVar2 = *(float *)(lVar5 + 4 + lVar16 * 0xc);
              lVar24 = *(int *)fn * lVar21 + lVar27;
              fVar40 = *(float *)(*(long *)((long)fn + 0x28) + lVar24 * 8);
              fVar38 = *(float *)(*(long *)((long)fn + 0x28) + 4 + lVar24 * 8);
              dVar33 = (double)-*(float *)(lVar5 + lVar16 * 0xc);
              dVar34 = cos(dVar33);
              dVar35 = sin(dVar33);
              fVar29 = (float)(dVar35 * 0.0 + dVar34);
              dVar34 = sin(dVar33);
              dVar33 = cos(dVar33);
              fVar30 = (float)(dVar33 * 0.0 - dVar34);
              dVar33 = (double)-*(float *)(*(long *)((long)__src + 0x20) +
                                          (*(int *)__src * lVar21 + lVar27) * 0xc);
              dVar34 = cos(dVar33);
              dVar35 = sin(dVar33);
              fVar31 = (float)(dVar34 * 0.0 + dVar35);
              dVar34 = sin(dVar33);
              dVar33 = cos(dVar33);
              fVar32 = (float)(dVar34 * -0.0 + dVar33);
              fVar40 = fVar40 - fVar28;
              fVar38 = fVar38 - fVar36;
              fVar39 = (fVar40 * fVar31 + fVar38 * fVar32) * (fVar37 / (fVar37 + 1.0));
              fVar37 = (fVar40 * fVar29 + fVar38 * fVar30) * (fVar2 / (fVar2 + 1.0));
              (*padVar4)[iVar10 + lVar27].x = fVar29 * fVar37 + fVar31 * fVar39 + fVar28;
              (*padVar4)[iVar10 + lVar27].y = fVar37 * fVar30 + fVar39 * fVar32 + fVar36;
              lVar27 = lVar27 + 1;
            } while (lVar27 < *(int *)((long)fn + 4));
          }
          iStack_23c = iStack_23c + 1;
        } while (iStack_23c < *(int *)((long)fn + 8));
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != extraout_EDX);
  }
  if (0 < *(int *)((long)fn + 8)) {
    iVar12 = 0;
    do {
      if (0 < *(int *)((long)fn + 4)) {
        iVar10 = p_00->res;
        padVar3 = p_00->flow_ptr;
        lVar18 = 0;
        do {
          *(disp_vect_t *)
           (*(long *)((long)fn + 0x28) + ((long)*(int *)fn * (long)iVar12 + lVar18) * 8) =
               (*padVar3)[(long)iVar10 * (long)iVar12 + lVar18];
          lVar18 = lVar18 + 1;
        } while (lVar18 < *(int *)((long)fn + 4));
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < *(int *)((long)fn + 8));
  }
  dealloc_flow(p);
  dealloc_flow(p_00);
  free(p);
  free(p_00);
  return;
}

Assistant:

void raster_size(fn,x,y,a)
char *fn ;
int *x, *y, *a ;

{ raster_t hd ;
  int fd, max ;

  if ((fd = open(fn,O_RDONLY)) > 0) {
    if (read(fd,&hd,sizeof(hd)) == sizeof(hd)) {
      *x = hd.width ;
      *y = hd.height ;
      if (*x > *y) {
        max = *x ;
      }
      else {
        max = *y ;
      }
      if (max <= N1 && max > N2) {
        *a = N1 ;
      }
      else if (max <= N2 && max > N3) {
        *a = N2 ;
      }
      else if (max <= N3 && max > N4) {
        *a = N3 ;
      }
      else {
        error(14) ;
      }
    }
    else {
      error(6) ;
    }
  }
  else {
    error(7) ;
  }
  close(fd) ;
}